

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimc.c
# Opt level: O0

void optsummary(opt_object obj)

{
  int local_14;
  int i;
  opt_object obj_local;
  
  printf("\n Return Value : %d \n",(ulong)(uint)obj->retval);
  printf("Method : %d %s \n",(ulong)(uint)obj->Method,obj->MethodName);
  printf("Iterations : %d \n",(ulong)(uint)obj->Iter);
  printf("Function Minimized At : [ ");
  for (local_14 = 0; local_14 < obj->N; local_14 = local_14 + 1) {
    printf("%g ",obj->xopt[local_14]);
  }
  printf(" ] \n");
  printf("Function Value : %g \n \n",obj->objfunc);
  return;
}

Assistant:

void optsummary(opt_object obj) {
	int i;
	printf("\n Return Value : %d \n",obj->retval);
	printf("Method : %d %s \n",obj->Method,obj->MethodName);
	printf("Iterations : %d \n",obj->Iter);
	printf("Function Minimized At : [ ");
	for(i = 0; i < obj->N;++i) {
		printf("%g ",obj->xopt[i]);
	}
	printf(" ] \n");
	printf("Function Value : %g \n \n",obj->objfunc);

}